

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anmmap.c
# Opt level: O0

int set(state_t *state,int linenum,seqmap_entry_t *ent)

{
  int iVar1;
  seqmap_entry_t *ent_local;
  int linenum_local;
  state_t *state_local;
  
  if (state->ident == 0) {
    if ((state->smap == state->amap->gvar_types) &&
       (iVar1 = validate_type(state,linenum,ent->value), iVar1 != 0)) {
      return 1;
    }
  }
  else {
    iVar1 = validate_ident(state,linenum,ent->value);
    if (iVar1 != 0) {
      return 1;
    }
  }
  seqmap_set(state->smap,ent);
  return 0;
}

Assistant:

static int
set(
    state_t* state,
    int linenum,
    const seqmap_entry_t* ent
) {
    if (state->ident) {
        if (validate_ident(state, linenum, ent->value))
            return 1;
    } else if (state->smap == state->amap->gvar_types) {
        if (validate_type(state, linenum, ent->value))
            return 1;
    }
    seqmap_set(state->smap, ent);
    return 0;
}